

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::ModfCase::getInputValues(ModfCase *this,int numValues,void **values)

{
  deUint32 dVar1;
  DataType dataType;
  Precision PVar2;
  int iVar3;
  char *str;
  const_reference pvVar4;
  vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  *this_00;
  float minValue;
  float maxValue;
  int scalarSize;
  Precision precision;
  DataType type;
  Random rnd;
  Vec2 ranges [3];
  void **values_local;
  int numValues_local;
  ModfCase *this_local;
  
  ranges[2].m_data = (float  [2])values;
  tcu::Vector<float,_2>::Vector((Vector<float,_2> *)&rnd.m_rnd.z,-2.0,2.0);
  tcu::Vector<float,_2>::Vector(ranges,-1000.0,1000.0);
  tcu::Vector<float,_2>::Vector(ranges + 1,-1e+07,1e+07);
  str = tcu::TestNode::getName((TestNode *)this);
  dVar1 = deStringHash(str);
  de::Random::Random((Random *)&precision,dVar1 ^ 0xac23f);
  this_00 = &(this->super_CommonFunctionCase).m_spec.inputs;
  pvVar4 = std::
           vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ::operator[](this_00,0);
  dataType = glu::VarType::getBasicType(&pvVar4->varType);
  pvVar4 = std::
           vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ::operator[](this_00,0);
  PVar2 = glu::VarType::getPrecision(&pvVar4->varType);
  iVar3 = glu::getDataTypeScalarSize(dataType);
  minValue = tcu::Vector<float,_2>::x(ranges + ((ulong)PVar2 - 1));
  maxValue = tcu::Vector<float,_2>::y(ranges + ((ulong)PVar2 - 1));
  fillRandomScalars<float>
            ((Random *)&precision,minValue,maxValue,*(void **)ranges[2].m_data,numValues * iVar3,0);
  de::Random::~Random((Random *)&precision);
  return;
}

Assistant:

void getInputValues (int numValues, void* const* values) const
	{
		const Vec2 ranges[] =
		{
			Vec2(-2.0f,		2.0f),	// lowp
			Vec2(-1e3f,		1e3f),	// mediump
			Vec2(-1e7f,		1e7f)	// highp
		};

		de::Random				rnd			(deStringHash(getName()) ^ 0xac23fu);
		const glu::DataType		type		= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision	= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize	= glu::getDataTypeScalarSize(type);

		fillRandomScalars(rnd, ranges[precision].x(), ranges[precision].y(), values[0], numValues*scalarSize);
	}